

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprCommute(Parse *pParse,Expr *pExpr)

{
  uint uVar1;
  Expr *pEVar2;
  CollSeq *pCVar3;
  Expr *t;
  u16 expLeft;
  u16 expRight;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  uVar1 = pExpr->pRight->flags;
  if (((ushort)uVar1 & 0x100) == ((ushort)pExpr->pLeft->flags & 0x100)) {
    if ((uVar1 & 0x100) == 0) {
      pCVar3 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
      if (pCVar3 != (CollSeq *)0x0) {
        pExpr->pLeft->flags = pExpr->pLeft->flags | 0x100;
      }
    }
    else {
      pExpr->pRight->flags = pExpr->pRight->flags & 0xfffffeff;
    }
  }
  pEVar2 = pExpr->pRight;
  pExpr->pRight = pExpr->pLeft;
  pExpr->pLeft = pEVar2;
  if (0x35 < pExpr->op) {
    pExpr->op = (pExpr->op - 0x36 ^ 2) + 0x36;
  }
  return;
}

Assistant:

static void exprCommute(Parse *pParse, Expr *pExpr){
  u16 expRight = (pExpr->pRight->flags & EP_Collate);
  u16 expLeft = (pExpr->pLeft->flags & EP_Collate);
  assert( allowedOp(pExpr->op) && pExpr->op!=TK_IN );
  if( expRight==expLeft ){
    /* Either X and Y both have COLLATE operator or neither do */
    if( expRight ){
      /* Both X and Y have COLLATE operators.  Make sure X is always
      ** used by clearing the EP_Collate flag from Y. */
      pExpr->pRight->flags &= ~EP_Collate;
    }else if( sqlite3ExprCollSeq(pParse, pExpr->pLeft)!=0 ){
      /* Neither X nor Y have COLLATE operators, but X has a non-default
      ** collating sequence.  So add the EP_Collate marker on X to cause
      ** it to be searched first. */
      pExpr->pLeft->flags |= EP_Collate;
    }
  }
  SWAP(Expr*,pExpr->pRight,pExpr->pLeft);
  if( pExpr->op>=TK_GT ){
    assert( TK_LT==TK_GT+2 );
    assert( TK_GE==TK_LE+2 );
    assert( TK_GT>TK_EQ );
    assert( TK_GT<TK_LE );
    assert( pExpr->op>=TK_GT && pExpr->op<=TK_GE );
    pExpr->op = ((pExpr->op-TK_GT)^2)+TK_GT;
  }
}